

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::considerColScaling
          (HighsSparseMatrix *this,HighsInt max_scale_factor_exponent,double *col_scale)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar7 = ldexp(1.0,max_scale_factor_exponent);
  if (this->format_ == kColwise) {
    lVar4 = 0;
    while (lVar6 = lVar4, lVar6 < this->num_col_) {
      piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar9 = 0.0;
      for (lVar4 = (long)piVar2[lVar6]; lVar4 < piVar2[lVar6 + 1]; lVar4 = lVar4 + 1) {
        dVar8 = ABS((this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar4]);
        if (dVar9 <= dVar8) {
          dVar9 = dVar8;
        }
      }
      lVar4 = lVar6 + 1;
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        dVar9 = log(1.0 / dVar9);
        dVar9 = floor(dVar9 / 0.6931471805599453 + 0.5);
        dVar9 = exp2(dVar9);
        if (dVar9 <= 1.0 / dVar7) {
          dVar9 = 1.0 / dVar7;
        }
        dVar8 = dVar7;
        if (dVar9 <= dVar7) {
          dVar8 = dVar9;
        }
        col_scale[lVar6] = dVar8;
        piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar2[lVar6 + 1];
        for (lVar5 = (long)piVar2[lVar6]; lVar5 < iVar1; lVar5 = lVar5 + 1) {
          pdVar3[lVar5] = col_scale[lVar6] * pdVar3[lVar5];
        }
      }
      else {
        col_scale[lVar6] = 1.0;
      }
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::considerColScaling(
    const HighsInt max_scale_factor_exponent, double* col_scale) {
  const double log2 = log(2.0);
  const double max_allow_scale = pow(2.0, max_scale_factor_exponent);
  const double min_allow_scale = 1 / max_allow_scale;

  const double min_allow_col_scale = min_allow_scale;
  const double max_allow_col_scale = max_allow_scale;

  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      double col_max_value = 0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        col_max_value = max(fabs(this->value_[iEl]), col_max_value);
      if (col_max_value) {
        double col_scale_value = 1 / col_max_value;
        // Convert the col scale factor to the nearest power of two, and
        // ensure that it is not excessively large or small
        col_scale_value = pow(2.0, floor(log(col_scale_value) / log2 + 0.5));
        col_scale_value =
            min(max(min_allow_col_scale, col_scale_value), max_allow_col_scale);
        col_scale[iCol] = col_scale_value;
        // Scale the column
        for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
             iEl++)
          this->value_[iEl] *= col_scale[iCol];
      } else {
        // Empty column
        col_scale[iCol] = 1;
      }
    }
  } else {
    assert(1 == 0);
  }
}